

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::TraceOfProduct::dim_forward
          (Dim *__return_storage_ptr__,TraceOfProduct *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  uint b;
  Dim *a;
  pointer pDVar2;
  bool bVar3;
  ostream *poVar4;
  invalid_argument *this_00;
  initializer_list<unsigned_int> x;
  uint local_14;
  
  a = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.super__Vector_impl_data.
      _M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)a == 0x48) {
    bVar3 = operator!=(a,a + 1);
    if (!bVar3) {
      pDVar2 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = pDVar2->bd;
      b = pDVar2[1].bd;
      if (b < uVar1) {
        b = uVar1;
      }
      x._M_len = 1;
      x._M_array = &local_14;
      Dim::Dim(__return_storage_ptr__,x,b);
      return __return_storage_ptr__;
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Bad arguments in TraceOfProduct: ");
  poVar4 = operator<<(poVar4,xs);
  std::endl<char,std::char_traits<char>>(poVar4);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid arguments to TraceOfProduct");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim TraceOfProduct::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 || xs[0] != xs[1]) {
    cerr << "Bad arguments in TraceOfProduct: " << xs << endl;
    throw std::invalid_argument("invalid arguments to TraceOfProduct");
  }
  return Dim({1}, max(xs[0].bd, xs[1].bd));
}